

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# future_std.h
# Opt level: O3

unique_ptr<prometheus::BasicAuthHandler,_std::default_delete<prometheus::BasicAuthHandler>_>
__thiscall
prometheus::detail::
make_unique<prometheus::BasicAuthHandler,std::function<bool(std::__cxx11::string_const&,std::__cxx11::string_const&)>,std::__cxx11::string_const&>
          (detail *this,
          function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *args,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  _Manager_type p_Var1;
  pointer pcVar2;
  BasicAuthHandler *this_00;
  _Any_data local_68;
  _Manager_type local_58;
  _Invoker_type local_50;
  string local_40;
  
  this_00 = (BasicAuthHandler *)operator_new(0x48);
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_58 = (_Manager_type)0x0;
  local_50 = args->_M_invoker;
  p_Var1 = (args->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_68._M_unused._0_8_ = (undefined8)*(undefined8 *)&(args->super__Function_base)._M_functor;
    local_68._8_8_ = *(undefined8 *)((long)&(args->super__Function_base)._M_functor + 8);
    (args->super__Function_base)._M_manager = (_Manager_type)0x0;
    args->_M_invoker = (_Invoker_type)0x0;
    local_58 = p_Var1;
  }
  pcVar2 = (args_1->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar2,pcVar2 + args_1->_M_string_length);
  BasicAuthHandler::BasicAuthHandler(this_00,(AuthFunc *)&local_68,&local_40);
  *(BasicAuthHandler **)this = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if (local_58 != (_Manager_type)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  return (__uniq_ptr_data<prometheus::BasicAuthHandler,_std::default_delete<prometheus::BasicAuthHandler>,_true,_true>
          )(__uniq_ptr_data<prometheus::BasicAuthHandler,_std::default_delete<prometheus::BasicAuthHandler>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> make_unique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}